

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlNodePtr xmlNewDocRawNode(xmlDocPtr doc,xmlNsPtr ns,xmlChar *name,xmlChar *content)

{
  xmlNodePtr cur;
  xmlNodePtr pxVar1;
  
  cur = xmlNewDocNode(doc,ns,name,(xmlChar *)0x0);
  if ((cur != (xmlNodePtr)0x0) && (cur->doc = doc, content != (xmlChar *)0x0)) {
    pxVar1 = xmlNewText(content);
    if (pxVar1 == (xmlNodePtr)0x0) {
      xmlFreeNode(cur);
      cur = (xmlNodePtr)0x0;
    }
    else {
      pxVar1->doc = doc;
      cur->children = pxVar1;
      cur->last = pxVar1;
      pxVar1->parent = cur;
    }
  }
  return cur;
}

Assistant:

xmlNodePtr
xmlNewDocRawNode(xmlDocPtr doc, xmlNsPtr ns,
                 const xmlChar *name, const xmlChar *content) {
    xmlNodePtr cur;

    cur = xmlNewDocNode(doc, ns, name, NULL);
    if (cur != NULL) {
        cur->doc = doc;
	if (content != NULL) {
            xmlNodePtr text;

	    text = xmlNewDocText(doc, content);
            if (text == NULL) {
                xmlFreeNode(cur);
                return(NULL);
            }

            cur->children = text;
            cur->last = text;
            text->parent = cur;
	}
    }
    return(cur);
}